

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O0

string * __thiscall
t_rb_generator::type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_rb_generator *this,t_type *ttype)

{
  byte bVar1;
  string *psVar2;
  string local_b8;
  string local_98;
  undefined1 local_78 [8];
  string name;
  allocator local_41;
  undefined1 local_40 [8];
  string prefix;
  t_type *ttype_local;
  t_rb_generator *this_local;
  
  prefix.field_2._8_8_ = ttype;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,"",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  psVar2 = (string *)(**(code **)(*(long *)prefix.field_2._8_8_ + 0x18))();
  std::__cxx11::string::string((string *)local_78,psVar2);
  bVar1 = (**(code **)(*(long *)prefix.field_2._8_8_ + 0x58))();
  if ((((bVar1 & 1) != 0) ||
      (bVar1 = (**(code **)(*(long *)prefix.field_2._8_8_ + 0x60))(), (bVar1 & 1) != 0)) ||
     (bVar1 = (**(code **)(*(long *)prefix.field_2._8_8_ + 0x50))(), (bVar1 & 1) != 0)) {
    psVar2 = (string *)(**(code **)(*(long *)prefix.field_2._8_8_ + 0x18))();
    std::__cxx11::string::string((string *)&local_b8,psVar2);
    t_generator::capitalize(&local_98,(t_generator *)this,&local_b8);
    std::__cxx11::string::operator=((string *)local_78,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string t_rb_generator::type_name(const t_type* ttype) {
  string prefix = "";

  string name = ttype->get_name();
  if (ttype->is_struct() || ttype->is_xception() || ttype->is_enum()) {
    name = capitalize(ttype->get_name());
  }

  return prefix + name;
}